

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::PatternMap::add
          (PatternMap *this,UnicodeString *basePattern,PtnSkeleton *skeleton,UnicodeString *value,
          UBool skeletonWasSpecified,UErrorCode *status)

{
  UBool UVar1;
  bool bVar2;
  char16_t cVar3;
  PtnElem *pPVar4;
  PtnSkeleton *pPVar5;
  size_t sVar6;
  PtnSkeleton *local_140;
  PtnElem *local_120;
  PtnSkeleton *local_e0;
  PtnElem *local_c0;
  LocalPointerBase<icu_63::PtnElem> local_90;
  LocalPointer<icu_63::PtnElem> newElem_1;
  LocalPointerBase<icu_63::PtnElem> local_58;
  LocalPointer<icu_63::PtnElem> newElem;
  PtnElem *baseElem;
  PtnElem *curElem;
  UChar baseChar;
  UErrorCode *status_local;
  UBool skeletonWasSpecified_local;
  UnicodeString *value_local;
  PtnSkeleton *skeleton_local;
  UnicodeString *basePattern_local;
  PatternMap *this_local;
  
  sVar6 = 0;
  cVar3 = icu_63::UnicodeString::charAt(basePattern,0);
  *status = U_ZERO_ERROR;
  if (((ushort)cVar3 < 0x41) || (0x5a < (ushort)cVar3)) {
    if (((ushort)cVar3 < 0x61) || (0x7a < (ushort)cVar3)) {
      *status = U_ILLEGAL_CHARACTER;
      return;
    }
    newElem.super_LocalPointerBase<icu_63::PtnElem>.ptr =
         (LocalPointerBase<icu_63::PtnElem>)this->boot[(int)((ushort)cVar3 - 0x47)];
  }
  else {
    newElem.super_LocalPointerBase<icu_63::PtnElem>.ptr =
         (LocalPointerBase<icu_63::PtnElem>)this->boot[(int)((ushort)cVar3 - 0x41)];
  }
  if (newElem.super_LocalPointerBase<icu_63::PtnElem>.ptr == (PtnElem *)0x0) {
    pPVar4 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,sVar6);
    local_c0 = (PtnElem *)0x0;
    if (pPVar4 != (PtnElem *)0x0) {
      PtnElem::PtnElem(pPVar4,basePattern,value);
      local_c0 = pPVar4;
    }
    LocalPointer<icu_63::PtnElem>::LocalPointer
              ((LocalPointer<icu_63::PtnElem> *)&local_58,local_c0,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 == '\0') {
      pPVar4 = LocalPointerBase<icu_63::PtnElem>::operator->(&local_58);
      pPVar5 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)local_c0);
      newElem_1.super_LocalPointerBase<icu_63::PtnElem>.ptr._7_1_ = 0;
      local_e0 = (PtnSkeleton *)0x0;
      if (pPVar5 != (PtnSkeleton *)0x0) {
        newElem_1.super_LocalPointerBase<icu_63::PtnElem>.ptr._7_1_ = 1;
        PtnSkeleton::PtnSkeleton(pPVar5,skeleton);
        local_e0 = pPVar5;
      }
      LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                (&pPVar4->skeleton,local_e0,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        pPVar4 = LocalPointerBase<icu_63::PtnElem>::operator->(&local_58);
        pPVar4->skeletonWasSpecified = skeletonWasSpecified;
        if ((ushort)cVar3 < 0x61) {
          pPVar4 = LocalPointerBase<icu_63::PtnElem>::orphan(&local_58);
          this->boot[(int)((ushort)cVar3 - 0x41)] = pPVar4;
        }
        else {
          pPVar4 = LocalPointerBase<icu_63::PtnElem>::orphan(&local_58);
          this->boot[(int)((ushort)cVar3 - 0x47)] = pPVar4;
        }
        bVar2 = false;
      }
      else {
        bVar2 = true;
      }
    }
    else {
      bVar2 = true;
    }
    LocalPointer<icu_63::PtnElem>::~LocalPointer((LocalPointer<icu_63::PtnElem> *)&local_58);
    if (bVar2) {
      return;
    }
  }
  if (newElem.super_LocalPointerBase<icu_63::PtnElem>.ptr != (PtnElem *)0x0) {
    pPVar4 = getDuplicateElem(this,basePattern,skeleton,
                              (PtnElem *)newElem.super_LocalPointerBase<icu_63::PtnElem>.ptr);
    if (pPVar4 == (PtnElem *)0x0) {
      baseElem = (PtnElem *)newElem.super_LocalPointerBase<icu_63::PtnElem>.ptr;
      while( true ) {
        sVar6 = 0;
        bVar2 = LocalPointerBase<icu_63::PtnElem>::operator!=
                          (&(baseElem->next).super_LocalPointerBase<icu_63::PtnElem>,(PtnElem *)0x0)
        ;
        if (!bVar2) break;
        baseElem = LocalPointerBase<icu_63::PtnElem>::getAlias
                             (&(baseElem->next).super_LocalPointerBase<icu_63::PtnElem>);
      }
      pPVar4 = (PtnElem *)UMemory::operator_new((UMemory *)0xa0,sVar6);
      local_120 = (PtnElem *)0x0;
      if (pPVar4 != (PtnElem *)0x0) {
        PtnElem::PtnElem(pPVar4,basePattern,value);
        local_120 = pPVar4;
      }
      LocalPointer<icu_63::PtnElem>::LocalPointer
                ((LocalPointer<icu_63::PtnElem> *)&local_90,local_120,status);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        pPVar4 = LocalPointerBase<icu_63::PtnElem>::operator->(&local_90);
        pPVar5 = (PtnSkeleton *)UMemory::operator_new((UMemory *)0x90,(size_t)local_120);
        local_140 = (PtnSkeleton *)0x0;
        if (pPVar5 != (PtnSkeleton *)0x0) {
          PtnSkeleton::PtnSkeleton(pPVar5,skeleton);
          local_140 = pPVar5;
        }
        LocalPointer<icu_63::PtnSkeleton>::adoptInsteadAndCheckErrorCode
                  (&pPVar4->skeleton,local_140,status);
        UVar1 = ::U_FAILURE(*status);
        if (UVar1 == '\0') {
          pPVar4 = LocalPointerBase<icu_63::PtnElem>::operator->(&local_90);
          pPVar4->skeletonWasSpecified = skeletonWasSpecified;
          pPVar4 = LocalPointerBase<icu_63::PtnElem>::orphan(&local_90);
          LocalPointer<icu_63::PtnElem>::adoptInstead(&baseElem->next,pPVar4);
          LocalPointerBase<icu_63::PtnElem>::getAlias
                    (&(baseElem->next).super_LocalPointerBase<icu_63::PtnElem>);
        }
      }
      LocalPointer<icu_63::PtnElem>::~LocalPointer((LocalPointer<icu_63::PtnElem> *)&local_90);
    }
    else if (this->isDupAllowed != '\0') {
      icu_63::UnicodeString::operator=(&pPVar4->pattern,value);
      pPVar4->skeletonWasSpecified = skeletonWasSpecified;
    }
  }
  return;
}

Assistant:

void
PatternMap::add(const UnicodeString& basePattern,
                const PtnSkeleton& skeleton,
                const UnicodeString& value,// mapped pattern value
                UBool skeletonWasSpecified,
                UErrorCode &status) {
    UChar baseChar = basePattern.charAt(0);
    PtnElem *curElem, *baseElem;
    status = U_ZERO_ERROR;

    // the baseChar must be A-Z or a-z
    if ((baseChar >= CAP_A) && (baseChar <= CAP_Z)) {
        baseElem = boot[baseChar-CAP_A];
    }
    else {
        if ((baseChar >=LOW_A) && (baseChar <= LOW_Z)) {
            baseElem = boot[26+baseChar-LOW_A];
         }
         else {
             status = U_ILLEGAL_CHARACTER;
             return;
         }
    }

    if (baseElem == nullptr) {
        LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
        if (U_FAILURE(status)) {
            return; // out of memory
        }
        newElem->skeletonWasSpecified = skeletonWasSpecified;
        if (baseChar >= LOW_A) {
            boot[26 + (baseChar - LOW_A)] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
        else {
            boot[baseChar - CAP_A] = newElem.orphan(); // the boot array now owns the PtnElem.
        }
    }
    if ( baseElem != nullptr ) {
        curElem = getDuplicateElem(basePattern, skeleton, baseElem);

        if (curElem == nullptr) {
            // add new element to the list.
            curElem = baseElem;
            while( curElem -> next != nullptr )
            {
                curElem = curElem->next.getAlias();
            }

            LocalPointer<PtnElem> newElem(new PtnElem(basePattern, value), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeleton.adoptInsteadAndCheckErrorCode(new PtnSkeleton(skeleton), status);
            if (U_FAILURE(status)) {
                return; // out of memory
            }
            newElem->skeletonWasSpecified = skeletonWasSpecified;
            curElem->next.adoptInstead(newElem.orphan());
            curElem = curElem->next.getAlias();
        }
        else {
            // Pattern exists in the list already.
            if ( !isDupAllowed ) {
                return;
            }
            // Overwrite the value.
            curElem->pattern = value;
            // It was a bug that we were not doing the following previously,
            // though that bug hid other problems by making things partly work.
            curElem->skeletonWasSpecified = skeletonWasSpecified;
        }
    }
}